

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O3

fdb_status fdb_set(fdb_kvs_handle *handle,fdb_doc *doc)

{
  ushort uVar1;
  fdb_kvs_id_t fVar2;
  size_t __n;
  void *__src;
  filemgr *pfVar3;
  docio_handle *handle_00;
  ulong uVar4;
  fdb_kvs_handle *pfVar5;
  list *list;
  btreeblk_handle *pbVar6;
  filemgr *pfVar7;
  undefined8 uVar8;
  bid_t prev_node_00;
  bool bVar9;
  uint8_t deleted;
  wal_dirty_t wVar10;
  ushort uVar11;
  uint32_t __useconds;
  fdb_status fVar12;
  fdb_seqnum_t fVar13;
  list_elem *offset;
  list_elem *e;
  list_elem *__dest;
  size_t sVar14;
  uint uVar15;
  timestamp_t tVar16;
  long lVar17;
  fdb_doc *pfVar18;
  undefined1 *buf;
  __suseconds_t *p_Var19;
  filemgr_dirty_update_node *pfVar20;
  list_elem *__size;
  void *__dest_00;
  bool bVar21;
  byte bVar22;
  char *pcStack_130;
  undefined1 local_128 [8];
  timeval tv;
  fdb_doc kv_ins_doc;
  _fdb_key_cmp_info cmp_info;
  undefined1 local_98 [24];
  undefined1 local_80 [16];
  undefined1 local_70 [24];
  bid_t local_58;
  bid_t dirty_idtree_root;
  bid_t dirty_seqtree_root;
  filemgr_dirty_update_node *prev_node;
  filemgr_dirty_update_node *new_node;
  
  bVar22 = 0;
  buf = local_128;
  if (handle == (fdb_kvs_handle *)0x0) {
    return FDB_RESULT_INVALID_HANDLE;
  }
  local_98._0_2_ = 0;
  local_98._2_2_ = 0;
  local_98._4_4_ = 0;
  local_98._8_4_ = 0;
  local_98[0xc] = '\0';
  local_98[0xd] = '\0';
  local_98._14_2_ = 0;
  local_98._16_4_ = 0;
  local_80 = (undefined1  [16])0x0;
  local_70._0_16_ = (undefined1  [16])0x0;
  if (((handle->config).flags & 2) != 0) {
    pcStack_130 = handle->file->filename;
    fVar12 = fdb_log_impl(&handle->log_callback,3,FDB_RESULT_RONLY_VIOLATION,
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/forestdb.cc"
                          ,"fdb_set",0x1025,
                          "Warning: SET is not allowed on the read-only DB file \'%s\'.");
    return fVar12;
  }
  if (doc == (fdb_doc *)0x0) {
    return FDB_RESULT_INVALID_ARGS;
  }
  if (doc->key == (void *)0x0) {
    return FDB_RESULT_INVALID_ARGS;
  }
  if (doc->keylen - 0xff81 < 0xffffffffffff0080) {
    return FDB_RESULT_INVALID_ARGS;
  }
  new_node = (filemgr_dirty_update_node *)handle->fhandle->root->txn;
  if ((doc->metalen != 0) && (doc->meta == (void *)0x0)) {
    return FDB_RESULT_INVALID_ARGS;
  }
  if ((doc->bodylen != 0) && (doc->body == (void *)0x0)) {
    return FDB_RESULT_INVALID_ARGS;
  }
  if (((handle->kvs_config).custom_cmp != (fdb_custom_cmp_variable)0x0) &&
     ((ulong)((handle->config).blocksize - 0x100) < doc->keylen)) {
    return FDB_RESULT_INVALID_ARGS;
  }
  local_98._4_4_ = 0;
  LOCK();
  bVar21 = (handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\0';
  if (bVar21) {
    (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\x01';
  }
  UNLOCK();
  if (!bVar21) {
    return FDB_RESULT_HANDLE_BUSY;
  }
  local_98._0_2_ = (undefined2)doc->keylen;
  local_98._2_2_ = (uint16_t)doc->metalen;
  if (doc->deleted == false) {
    local_98._4_4_ = (undefined4)doc->bodylen;
    local_70._8_8_ = doc->body;
  }
  else {
    local_70._8_8_ = (void *)0x0;
  }
  local_98._8_8_ = 0;
  local_80._8_8_ = 0;
  local_80._0_8_ = doc->key;
  local_70._0_8_ = doc->meta;
  if (handle->kvs == (kvs_info *)0x0) {
    bVar21 = false;
  }
  else {
    uVar1 = (handle->config).chunksize;
    uVar11 = local_98._0_2_ + uVar1;
    local_98._2_6_ = SUB86(local_98._0_8_,2);
    local_98._0_2_ = uVar11;
    local_98._8_8_ = 0;
    lVar17 = -(ulong)(uVar11 + 0xf & 0xfffffff0);
    buf = local_128 + lVar17;
    local_80._8_8_ = 0;
    local_80._0_8_ = buf;
    fVar2 = handle->kvs->id;
    *(undefined8 *)(local_128 + lVar17 + -8) = 0x130cbc;
    kvid2buf((ulong)uVar1,fVar2,buf);
    __dest_00 = (void *)((ulong)uVar1 + local_80._0_8_);
    __n = doc->keylen;
    __src = doc->key;
    *(undefined8 *)(local_128 + lVar17 + -8) = 0x130ccf;
    memcpy(__dest_00,__src,__n);
    bVar21 = handle->kvs->type == '\x01';
  }
  while( true ) {
    *(undefined8 *)(buf + -8) = 0x130ce9;
    fdb_check_file_reopen(handle,(file_status_t *)0x0);
    pfVar3 = handle->file;
    *(undefined8 *)(buf + -8) = 0x130cf2;
    __useconds = filemgr_get_throttling_delay(pfVar3);
    if (__useconds != 0) {
      *(undefined8 *)(buf + -8) = 0x130cfd;
      usleep(__useconds);
    }
    kv_ins_doc.deleted = (handle->kvs_config).create_if_missing;
    kv_ins_doc._73_3_ = *(undefined3 *)&(handle->kvs_config).field_0x1;
    kv_ins_doc.flags = *(uint32_t *)&(handle->kvs_config).field_0x4;
    pfVar3 = handle->file;
    *(undefined8 *)(buf + -8) = 0x130d28;
    filemgr_mutex_lock(pfVar3);
    *(undefined8 *)(buf + -8) = 0x130d30;
    fdb_sync_db_header(handle);
    pfVar3 = handle->file;
    *(undefined8 *)(buf + -8) = 0x130d39;
    bVar9 = filemgr_is_rollback_on(pfVar3);
    pfVar3 = handle->file;
    if (bVar9) {
      *(undefined8 *)(buf + -8) = 0x130d62;
      filemgr_mutex_unlock(pfVar3);
      LOCK();
      if ((handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\x01') {
        (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
      }
      UNLOCK();
      return FDB_RESULT_FAIL_BY_ROLLBACK;
    }
    handle_00 = handle->dhandle;
    if ((pfVar3->status).super___atomic_base<unsigned_char>._M_i != '\x04') break;
    *(undefined8 *)(buf + -8) = 0x130d58;
    filemgr_mutex_unlock(pfVar3);
  }
  if (bVar21) {
    fVar2 = handle->kvs->id;
    *(undefined8 *)(buf + -8) = 0x130d8e;
    fVar13 = fdb_kvs_get_seqnum(pfVar3,fVar2);
    uVar4 = doc->seqnum;
    if ((uVar4 == 0xffffffffffffffff) || (uVar15 = doc->flags, (uVar15 & 1) == 0)) {
      fVar13 = fVar13 + 1;
      doc->seqnum = fVar13;
      handle->seqnum = fVar13;
      fVar2 = handle->kvs->id;
      *(undefined8 *)(buf + -8) = 0x130dc2;
      fdb_kvs_set_seqnum(pfVar3,fVar2,fVar13);
    }
    else {
      if (fVar13 < uVar4) {
        handle->seqnum = uVar4;
        fVar2 = handle->kvs->id;
        *(undefined8 *)(buf + -8) = 0x130e16;
        fdb_kvs_set_seqnum(pfVar3,fVar2,uVar4);
LAB_00130e2c:
        uVar15 = doc->flags;
      }
LAB_00130e30:
      doc->flags = uVar15 & 0xfffffffe;
    }
  }
  else {
    *(undefined8 *)(buf + -8) = 0x130dcc;
    fVar13 = filemgr_get_seqnum(pfVar3);
    uVar4 = doc->seqnum;
    if ((uVar4 != 0xffffffffffffffff) && (uVar15 = doc->flags, (uVar15 & 1) != 0)) {
      if (fVar13 < uVar4) {
        handle->seqnum = uVar4;
        *(undefined8 *)(buf + -8) = 0x130e2c;
        filemgr_set_seqnum(pfVar3,uVar4);
        goto LAB_00130e2c;
      }
      goto LAB_00130e30;
    }
    fVar13 = fVar13 + 1;
    doc->seqnum = fVar13;
    handle->seqnum = fVar13;
    *(undefined8 *)(buf + -8) = 0x130df8;
    filemgr_set_seqnum(pfVar3,fVar13);
  }
  local_80._8_8_ = doc->seqnum;
  deleted = doc->deleted;
  tVar16 = 0;
  if ((bool)deleted == true) {
    *(undefined8 *)(buf + -8) = 0x130e5a;
    gettimeofday((timeval *)local_128,(__timezone_ptr_t)0x0);
    deleted = doc->deleted;
    tVar16 = local_128._0_4_;
  }
  bVar21 = new_node != (filemgr_dirty_update_node *)0x0;
  local_98._16_4_ = tVar16;
  *(undefined8 *)(buf + -8) = 0x130e81;
  offset = (list_elem *)docio_append_doc(handle_00,(docio_object *)local_98,deleted,bVar21);
  if (offset == (list_elem *)0xffffffffffffffff) {
    *(undefined8 *)(buf + -8) = 0x130ea3;
    filemgr_mutex_unlock(pfVar3);
    LOCK();
    if ((handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\x01') {
      (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
    }
    UNLOCK();
    return FDB_RESULT_WRITE_FAIL;
  }
  if (doc->deleted == true) {
    bVar21 = (handle->config).purging_interval == 0;
  }
  else {
    bVar21 = false;
  }
  uVar8 = local_98._0_8_;
  doc->size_ondisk =
       (ulong)((local_98._0_4_ & 0xffff) + (local_98._2_4_ & 0xffff) + local_98._8_4_) + 0x20;
  doc->offset = (uint64_t)offset;
  pfVar20 = (filemgr_dirty_update_node *)&pfVar3->global_txn;
  if (new_node != (filemgr_dirty_update_node *)0x0) {
    pfVar20 = new_node;
  }
  if ((handle->config).bottom_up_index_build == true) {
    *(undefined8 *)(buf + -8) = 0x130f1c;
    e = (list_elem *)malloc(0x30);
    __size = (list_elem *)(uVar8 & 0xffff);
    e[1].next = __size;
    *(undefined8 *)(buf + -8) = 0x130f2f;
    __dest = (list_elem *)malloc((size_t)__size);
    e[1].prev = __dest;
    uVar8 = local_80._0_8_;
    *(undefined8 *)(buf + -8) = 0x130f43;
    memcpy(__dest,(void *)uVar8,(size_t)__size);
    e[2].next = (list_elem *)doc->seqnum;
    e[2].prev = offset;
    pfVar5 = handle->fhandle->root;
    list = (pfVar5->bub_ctx).entries;
    *(undefined8 *)(buf + -8) = 0x130f6e;
    list_push_back(list,e);
    sVar14 = doc->size_ondisk;
    (pfVar5->bub_ctx).num_entries = (pfVar5->bub_ctx).num_entries + 1;
    (pfVar5->bub_ctx).space_used = sVar14 + (pfVar5->bub_ctx).space_used;
  }
  else {
    pfVar18 = doc;
    if (handle->kvs != (kvs_info *)0x0) {
      p_Var19 = &tv.tv_usec;
      for (lVar17 = 10; lVar17 != 0; lVar17 = lVar17 + -1) {
        *p_Var19 = pfVar18->keylen;
        pfVar18 = (fdb_doc *)((long)pfVar18 + (ulong)bVar22 * -0x10 + 8);
        p_Var19 = p_Var19 + (ulong)bVar22 * -2 + 1;
      }
      kv_ins_doc.size_ondisk = local_80._0_8_;
      tv.tv_usec = uVar8 & 0xffff;
      pfVar18 = (fdb_doc *)&tv.tv_usec;
    }
    if (bVar21) {
      *(undefined8 *)(buf + -8) = 0x130ffc;
      wal_immediate_remove
                ((fdb_txn *)pfVar20,pfVar3,(_fdb_key_cmp_info *)&kv_ins_doc.deleted,pfVar18,
                 (uint64_t)offset,0);
    }
    else {
      *(undefined8 *)(buf + -8) = 0x131009;
      wal_insert((fdb_txn *)pfVar20,pfVar3,(_fdb_key_cmp_info *)&kv_ins_doc.deleted,pfVar18,
                 (uint64_t)offset,0);
    }
    *(undefined8 *)(buf + -8) = 0x131011;
    wVar10 = wal_get_dirty_status(pfVar3);
    if (wVar10 == '\0') {
      *(undefined8 *)(buf + -8) = 0x131024;
      wal_set_dirty_status(pfVar3,'\x01',false);
    }
  }
  if ((handle->config).auto_commit == true) {
    *(undefined8 *)(buf + -8) = 0x131035;
    sVar14 = wal_get_num_flushable(pfVar3);
    bVar21 = true;
    if ((handle->config).wal_threshold < sVar14) goto LAB_0013109f;
  }
  if ((handle->config).wal_flush_before_commit == true) {
    local_58 = 0xffffffffffffffff;
    dirty_idtree_root = 0xffffffffffffffff;
    if (new_node == (filemgr_dirty_update_node *)0x0) {
      handle->dirty_updates = '\x01';
    }
    *(undefined8 *)(buf + -8) = 0x13106f;
    sVar14 = wal_get_num_flushable(pfVar3);
    if ((handle->config).wal_threshold < sVar14) {
      *(undefined8 *)(buf + -8) = 0x131090;
      fVar12 = wal_commit(&pfVar3->global_txn,pfVar3,(wal_commit_mark_func *)0x0,
                          &handle->log_callback);
      if (fVar12 != FDB_RESULT_SUCCESS) {
LAB_00131183:
        *(undefined8 *)(buf + -8) = 0x13118b;
        filemgr_mutex_unlock(pfVar3);
        LOCK();
        if ((handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\x01') {
          (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
        }
        UNLOCK();
        return fVar12;
      }
      dirty_seqtree_root = 0;
      prev_node = (filemgr_dirty_update_node *)0x0;
      *(undefined8 *)(buf + -8) = 0x13111e;
      _fdb_dirty_update_ready
                (handle,(filemgr_dirty_update_node **)&dirty_seqtree_root,&prev_node,&local_58,
                 &dirty_idtree_root,true);
      *(__suseconds_t **)(buf + -0x10) = &tv.tv_usec;
      *(undefined8 *)(buf + -0x18) = 0x131151;
      fVar12 = wal_flush(pfVar3,handle,_fdb_wal_flush_func,_fdb_wal_get_old_offset,
                         _fdb_wal_flush_seq_purge,_fdb_wal_flush_kvs_delta_stats,
                         *(wal_flush_items **)(buf + -0x10));
      pfVar20 = prev_node;
      prev_node_00 = dirty_seqtree_root;
      if (fVar12 != FDB_RESULT_SUCCESS) {
        pbVar6 = handle->bhandle;
        pbVar6->dirty_update = (filemgr_dirty_update_node *)0x0;
        pbVar6->dirty_update_writer = (filemgr_dirty_update_node *)0x0;
        pfVar7 = handle->file;
        *(undefined8 *)(buf + -8) = 0x131176;
        filemgr_dirty_update_close_node(pfVar7,(filemgr_dirty_update_node *)prev_node_00);
        pfVar20 = prev_node;
        pfVar7 = handle->file;
        *(undefined8 *)(buf + -8) = 0x131183;
        filemgr_dirty_update_remove_node(pfVar7,pfVar20);
        goto LAB_00131183;
      }
      *(undefined8 *)(buf + -8) = 0x1311b7;
      _fdb_dirty_update_finalize
                (handle,(filemgr_dirty_update_node *)prev_node_00,pfVar20,&local_58,
                 &dirty_idtree_root,false);
      *(undefined8 *)(buf + -8) = 0x1311c6;
      wal_set_dirty_status(pfVar3,'\x02',false);
      *(undefined8 *)(buf + -8) = 0x1311d5;
      wal_release_flushed_items(pfVar3,(wal_flush_items *)&tv.tv_usec);
      pbVar6 = handle->bhandle;
      *(undefined8 *)(buf + -8) = 0x1311de;
      btreeblk_reset_subblock_info(pbVar6);
      bVar21 = true;
      goto LAB_0013109f;
    }
  }
  bVar21 = false;
LAB_0013109f:
  *(undefined8 *)(buf + -8) = 0x1310a7;
  filemgr_mutex_unlock(pfVar3);
  if (doc->deleted == false) {
    LOCK();
    (handle->op_stats->num_sets).super___atomic_base<unsigned_long>._M_i =
         (handle->op_stats->num_sets).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
  }
  if ((bVar21) && ((handle->config).auto_commit == true)) {
    LOCK();
    if ((handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\x01') {
      (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
    }
    UNLOCK();
    pfVar5 = handle->fhandle->root;
    *(undefined8 *)(buf + -8) = 0x1310e0;
    fVar12 = _fdb_commit(pfVar5,'\0',false);
  }
  else {
    fVar12 = FDB_RESULT_SUCCESS;
    LOCK();
    if ((handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\x01') {
      (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
    }
    UNLOCK();
  }
  return fVar12;
}

Assistant:

LIBFDB_API
fdb_status fdb_set(fdb_kvs_handle *handle, fdb_doc *doc)
{
    if (!handle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    uint64_t offset;
    struct docio_object _doc;
    struct filemgr *file;
    struct docio_handle *dhandle;
    struct timeval tv;
    bool txn_enabled = false;
    bool sub_handle = false;
    bool wal_flushed = false;
    bool immediate_remove = false;
    file_status_t fstatus;
    fdb_txn *txn = handle->fhandle->root->txn;
    struct _fdb_key_cmp_info cmp_info;
    fdb_status wr = FDB_RESULT_SUCCESS;
    LATENCY_STAT_START();

    if (handle->config.flags & FDB_OPEN_FLAG_RDONLY) {
        return fdb_log(&handle->log_callback, FDB_LOG_WARNING,
                       FDB_RESULT_RONLY_VIOLATION,
                       "Warning: SET is not allowed on the read-only DB file '%s'.",
                       handle->file->filename);
    }

    if (!doc || doc->key == NULL ||
        doc->keylen == 0 || doc->keylen > FDB_MAX_KEYLEN ||
        (doc->metalen > 0 && doc->meta == NULL) ||
        (doc->bodylen > 0 && doc->body == NULL) ||
        (handle->kvs_config.custom_cmp &&
            doc->keylen > handle->config.blocksize - HBTRIE_HEADROOM)) {
        return FDB_RESULT_INVALID_ARGS;
    }

    if (!atomic_cas_uint8_t(&handle->handle_busy, 0, 1)) {
        return FDB_RESULT_HANDLE_BUSY;
    }

    _doc.length.keylen = doc->keylen;
    _doc.length.metalen = doc->metalen;
    _doc.length.bodylen = doc->deleted ? 0 : doc->bodylen;
    _doc.key = doc->key;
    _doc.meta = doc->meta;
    _doc.body = doc->deleted ? NULL : doc->body;

    if (handle->kvs) {
        // multi KV instance mode
        // allocate more (temporary) space for key, to store ID number
        int size_chunk = handle->config.chunksize;
        _doc.length.keylen = doc->keylen + size_chunk;
        _doc.key = alca(uint8_t, _doc.length.keylen);
        // copy ID
        kvid2buf(size_chunk, handle->kvs->id, _doc.key);
        // copy key
        memcpy((uint8_t*)_doc.key + size_chunk, doc->key, doc->keylen);

        if (handle->kvs->type == KVS_SUB) {
            sub_handle = true;
        } else {
            sub_handle = false;
        }
    }

fdb_set_start:
    fdb_check_file_reopen(handle, NULL);

    size_t throttling_delay = filemgr_get_throttling_delay(handle->file);
    if (throttling_delay) {
        usleep(throttling_delay);
    }

    cmp_info.kvs_config = handle->kvs_config;
    cmp_info.kvs = handle->kvs;

    filemgr_mutex_lock(handle->file);
    fdb_sync_db_header(handle);

    if (filemgr_is_rollback_on(handle->file)) {
        filemgr_mutex_unlock(handle->file);
        atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
        return FDB_RESULT_FAIL_BY_ROLLBACK;
    }

    file = handle->file;
    dhandle = handle->dhandle;

    fstatus = filemgr_get_file_status(file);
    if (fstatus == FILE_REMOVED_PENDING) {
        // we must not write into this file
        // file status was changed by other thread .. start over
        filemgr_mutex_unlock(file);
        goto fdb_set_start;
    }

    if (sub_handle) {
        // multiple KV instance mode AND sub handle
        fdb_seqnum_t kv_seqnum = fdb_kvs_get_seqnum(file,
                                                    handle->kvs->id);
        if (doc->seqnum != SEQNUM_NOT_USED &&
            doc->flags & FDB_CUSTOM_SEQNUM) { // User specified own seqnum
            if (kv_seqnum < doc->seqnum) { // track highest seqnum in handle,kv
                handle->seqnum = doc->seqnum;
                fdb_kvs_set_seqnum(file, handle->kvs->id,
                                   handle->seqnum);
            }
            doc->flags &= ~FDB_CUSTOM_SEQNUM; // clear flag for fdb_doc reuse
        } else { // normal monotonically increasing sequence numbers..
            doc->seqnum = ++kv_seqnum;
            handle->seqnum = doc->seqnum; // keep handle's seqnum the highest
            fdb_kvs_set_seqnum(file, handle->kvs->id, handle->seqnum);
        }
    } else {
        fdb_seqnum_t kv_seqnum = filemgr_get_seqnum(file);
        // super handle OR single KV instance mode
        if (doc->seqnum != SEQNUM_NOT_USED &&
            doc->flags & FDB_CUSTOM_SEQNUM) { // User specified own seqnum
            if (kv_seqnum < doc->seqnum) { // track highest seqnum in handle,kv
                handle->seqnum = doc->seqnum;
                filemgr_set_seqnum(file, handle->seqnum);
            }
            doc->flags &= ~FDB_CUSTOM_SEQNUM; // clear flag for fdb_doc reuse
        } else { // normal monotonically increasing sequence numbers..
            doc->seqnum = ++kv_seqnum;
            handle->seqnum = doc->seqnum;
            filemgr_set_seqnum(file, handle->seqnum);
        }
    }
    _doc.seqnum = doc->seqnum;

    if (doc->deleted) {
        // set timestamp
        gettimeofday(&tv, NULL);
        _doc.timestamp = (timestamp_t)tv.tv_sec;
    } else {
        _doc.timestamp = 0;
    }

    if (txn) {
        txn_enabled = true;
    }

    offset = docio_append_doc(dhandle, &_doc, doc->deleted, txn_enabled);
    if (offset == BLK_NOT_FOUND) {
        filemgr_mutex_unlock(file);
        atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
        return FDB_RESULT_WRITE_FAIL;
    }

    if (doc->deleted && !handle->config.purging_interval) {
        // immediately remove from hbtrie upon WAL flush
        immediate_remove = true;
    }

    doc->size_ondisk = _fdb_get_docsize(_doc.length);
    doc->offset = offset;
    if (!txn) {
        txn = &file->global_txn;
    }

    if (handle->config.bottom_up_index_build) {
        // Bottom-up build mode, bypass WAL.
        struct bottom_up_build_entry* bub_entry =
            (struct bottom_up_build_entry*)
            malloc(sizeof(struct bottom_up_build_entry));
        bub_entry->keylen = _doc.length.keylen;
        bub_entry->key = (void*)malloc(_doc.length.keylen);
        memcpy(bub_entry->key, _doc.key, _doc.length.keylen);
        bub_entry->seqnum = doc->seqnum;
        bub_entry->offset = doc->offset;

        fdb_kvs_handle* root_handle = handle->fhandle->root;
        list_push_back(root_handle->bub_ctx.entries, &bub_entry->le);
        root_handle->bub_ctx.num_entries++;
        root_handle->bub_ctx.space_used += doc->size_ondisk;

    } else {
        if (handle->kvs) {
            // multi KV instance mode
            fdb_doc kv_ins_doc = *doc;
            kv_ins_doc.key = _doc.key;
            kv_ins_doc.keylen = _doc.length.keylen;
            if (!immediate_remove) {
                wal_insert(txn, file, &cmp_info, &kv_ins_doc, offset,
                           WAL_INS_WRITER);
            } else {
                wal_immediate_remove(txn, file, &cmp_info, &kv_ins_doc, offset,
                                     WAL_INS_WRITER);
            }
        } else {
            if (!immediate_remove) {
                wal_insert(txn, file, &cmp_info, doc, offset, WAL_INS_WRITER);
            } else {
                wal_immediate_remove(txn, file, &cmp_info, doc, offset,
                                     WAL_INS_WRITER);
            }
        }

        if (wal_get_dirty_status(file)== FDB_WAL_CLEAN) {
            wal_set_dirty_status(file, FDB_WAL_DIRTY);
        }
    }

    if (handle->config.auto_commit &&
        wal_get_num_flushable(file) > _fdb_get_wal_threshold(handle)) {
        // we don't need dirty WAL flushing in auto commit mode
        // (_fdb_commit() is internally called at the end of this function)
        wal_flushed = true;

    } else if (handle->config.wal_flush_before_commit) {

        bid_t dirty_idtree_root = BLK_NOT_FOUND;
        bid_t dirty_seqtree_root = BLK_NOT_FOUND;

        if (!txn_enabled) {
            handle->dirty_updates = 1;
        }

        if (wal_get_num_flushable(file) > _fdb_get_wal_threshold(handle)) {
            union wal_flush_items flush_items;

            // commit only for non-transactional WAL entries
            wr = wal_commit(&file->global_txn, file, NULL, &handle->log_callback);
            if (wr != FDB_RESULT_SUCCESS) {
                filemgr_mutex_unlock(file);
                atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
                return wr;
            }

            struct filemgr_dirty_update_node *prev_node = NULL, *new_node = NULL;

            _fdb_dirty_update_ready(handle, &prev_node, &new_node,
                                    &dirty_idtree_root, &dirty_seqtree_root, true);

            wr = wal_flush(file, (void *)handle,
                           _fdb_wal_flush_func, _fdb_wal_get_old_offset,
                           _fdb_wal_flush_seq_purge, _fdb_wal_flush_kvs_delta_stats,
                           &flush_items);

            if (wr != FDB_RESULT_SUCCESS) {
                btreeblk_clear_dirty_update(handle->bhandle);
                filemgr_dirty_update_close_node(handle->file, prev_node);
                filemgr_dirty_update_remove_node(handle->file, new_node);
                filemgr_mutex_unlock(file);
                atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
                return wr;
            }

            _fdb_dirty_update_finalize(handle, prev_node, new_node,
                                       &dirty_idtree_root, &dirty_seqtree_root, false);

            wal_set_dirty_status(file, FDB_WAL_PENDING);
            // it is ok to release flushed items becuase
            // these items are not actually committed yet.
            // they become visible after fdb_commit is invoked.
            wal_release_flushed_items(file, &flush_items);

            wal_flushed = true;
            btreeblk_reset_subblock_info(handle->bhandle);
        }
    }

    filemgr_mutex_unlock(file);

    LATENCY_STAT_END(file, FDB_LATENCY_SETS);

    if (!doc->deleted) {
        atomic_incr_uint64_t(&handle->op_stats->num_sets, std::memory_order_relaxed);
    }

    if (wal_flushed && handle->config.auto_commit) {
        atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
        return _fdb_commit(handle->fhandle->root, FDB_COMMIT_NORMAL,
                           false); // asynchronous commit only
    }
    atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
    return FDB_RESULT_SUCCESS;
}